

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_main_main.cpp
# Opt level: O3

int sc_elab_and_sim(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong __n;
  char CODENL [4];
  vector<char_*,_std::allocator<char_*>_> argv_copy;
  char MSGNL [15];
  vector<char_*,_std::allocator<char_*>_> argv_call;
  char local_1fc [4];
  vector<char_*,_std::allocator<char_*>_> local_1f8;
  char local_1e0 [16];
  char *local_1d0 [2];
  char local_1c0 [16];
  undefined1 local_1b0 [16];
  pointer local_1a0;
  
  local_1b0._0_8_ = (pointer)0x0;
  sc_core::argc_orig = argc;
  sc_core::argv_orig = argv;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            (&local_1f8,(long)(argc + 1),(value_type *)local_1b0,(allocator_type *)local_1d0);
  if (0 < argc) {
    uVar6 = 0;
    do {
      sVar4 = strlen(argv[uVar6]);
      __n = sVar4 + 1;
      pcVar5 = (char *)operator_new__(__n);
      local_1f8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = pcVar5;
      if (__n != 0) {
        memmove(local_1f8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6],argv[uVar6],__n);
      }
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
  }
  sc_core::pln();
  sc_core::sc_in_action = 1;
  std::vector<char_*,_std::allocator<char_*>_>::vector
            ((vector<char_*,_std::allocator<char_*>_> *)local_1b0,&local_1f8);
  iVar2 = sc_main(argc,local_1b0._0_8_);
  sc_core::sc_in_action = 0;
  if ((pointer)local_1b0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b0._0_8_);
  }
  if (0 < argc) {
    uVar6 = 0;
    do {
      if (local_1f8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar6] != (char *)0x0) {
        operator_delete__(local_1f8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6]);
      }
      uVar6 = uVar6 + 1;
    } while ((uint)argc != uVar6);
  }
  iVar3 = sc_core::sc_report_handler::get_count("/IEEE_Std_1666/deprecated");
  if (0 < iVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    builtin_strncpy(local_1e0,"\n             ",0xf);
    builtin_strncpy(local_1fc,"\n  ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"You can turn off warnings about",0x1f);
    sVar4 = strlen(local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,local_1e0,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"IEEE 1666 deprecated features by placing this method call",
               0x39);
    sVar4 = strlen(local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,local_1e0,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"as the first statement in your sc_main() function:\n",0x33);
    sVar4 = strlen(local_1fc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,local_1fc,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"sc_core::sc_report_handler::set_actions( ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\"",1);
    sVar4 = strlen("/IEEE_Std_1666/deprecated");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"/IEEE_Std_1666/deprecated",sVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"\",",2);
    sVar4 = strlen(local_1fc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,local_1fc,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"                                         ",0x29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"sc_core::SC_DO_NOTHING );",0x19);
    cVar1 = (char)(ostream *)&local_1a0;
    std::ios::widen((char)local_1a0[-3] + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    sc_core::sc_report_handler::report
              (SC_INFO,"/IEEE_Std_1666/deprecated",local_1d0[0],
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_main_main.cpp"
               ,0x83);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  }
  if (local_1f8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int
sc_elab_and_sim( int argc, char* argv[] )
{
    int status = 1;
    argc_orig = argc;
    argv_orig = argv;

    // Copy argv into a new structure to prevent sc_main from modifying the
    // result returned from sc_argv.
    std::vector<char*> argv_copy(argc + 1, static_cast<char*>(NULL));
    for ( int i = 0; i < argc; ++i ) {
        std::size_t size = std::strlen(argv[i]) + 1;
        argv_copy[i] = new char[size];
        std::copy(argv[i], argv[i] + size, argv_copy[i]);
    }

    try
    {
        pln();

        // Perform initialization here
        sc_in_action = true;

        // copy array of pointers to keep allocated pointers for later release
        std::vector<char*> argv_call = argv_copy;
        status = sc_main( argc, &argv_call[0] );

        // Perform cleanup here
        sc_in_action = false;
    }
    catch( const sc_report& x )
    {
        sc_report_handler::get_handler()
            ( x, sc_report_handler::get_catch_actions() );
    }
    catch( ... )
    {
        // translate other escaping exceptions
        sc_report*  err_p = sc_handle_exception();
        if( err_p )
            sc_report_handler::get_handler()
                ( *err_p, sc_report_handler::get_catch_actions() );
        delete err_p;
    }

    for ( int i = 0; i < argc; ++i ) {
        delete[] argv_copy[i];
    }

    // IF DEPRECATION WARNINGS WERE ISSUED TELL THE USER HOW TO TURN THEM OFF

    if ( sc_report_handler::get_count( SC_ID_IEEE_1666_DEPRECATION_ ) > 0 )
    {
        std::stringstream ss;

        const char MSGNL[] = "\n             ";
        const char CODENL[] = "\n  ";

        ss << "You can turn off warnings about" << MSGNL
           << "IEEE 1666 deprecated features by placing this method call" << MSGNL
           << "as the first statement in your sc_main() function:\n" << CODENL
           << "sc_core::sc_report_handler::set_actions( "
           << "\"" << SC_ID_IEEE_1666_DEPRECATION_ << "\"," << CODENL
           << "                                         " /* indent param */
           << "sc_core::SC_DO_NOTHING );"
           << std::endl;

        SC_REPORT_INFO( SC_ID_IEEE_1666_DEPRECATION_, ss.str().c_str() );
    }

    return status;
}